

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinJoin
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Value *pVVar1;
  Value *pVVar2;
  Type TVar3;
  pointer pVVar4;
  pointer pFVar5;
  pointer ppHVar6;
  anon_union_8_3_4e909c26_for_v aVar7;
  undefined4 uVar8;
  AST *pAVar9;
  ostream *poVar10;
  RuntimeError *pRVar11;
  Value *v;
  Value *v_00;
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  pVVar4 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  TVar3 = pVVar4->t;
  if ((TVar3 != ARRAY) && (TVar3 != STRING)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar10 = std::operator<<(local_1a0,"join first parameter should be string or array, got ");
    (anonymous_namespace)::type_str_abi_cxx11_
              (&local_1d0,
               (_anonymous_namespace_ *)
               (args->
               super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
               )._M_impl.super__Vector_impl_data._M_start,v_00);
    std::operator<<(poVar10,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    pRVar11 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar11,&this->stack,loc,&local_1d0);
    __cxa_throw(pRVar11,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (pVVar4[1].t != ARRAY) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar10 = std::operator<<(local_1a0,"join second parameter should be array, got ");
    (anonymous_namespace)::type_str_abi_cxx11_
              (&local_1d0,
               (_anonymous_namespace_ *)
               ((args->
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                )._M_impl.super__Vector_impl_data._M_start + 1),v);
    std::operator<<(poVar10,(string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    pRVar11 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar11,&this->stack,loc,&local_1d0);
    __cxa_throw(pRVar11,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  pFVar5 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pVVar1 = &pFVar5[-1].val;
  pVVar2 = &pFVar5[-1].val2;
  if (TVar3 == STRING) {
    pFVar5[-1].kind = FRAME_BUILTIN_JOIN_STRINGS;
    uVar8 = *(undefined4 *)&pVVar4->field_0x4;
    aVar7 = pVVar4->v;
    pVVar1->t = pVVar4->t;
    *(undefined4 *)&pVVar1->field_0x4 = uVar8;
    pFVar5[-1].val.v = aVar7;
    pVVar4 = (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = *(undefined4 *)&pVVar4[1].field_0x4;
    aVar7 = pVVar4[1].v;
    pVVar2->t = pVVar4[1].t;
    *(undefined4 *)&pVVar2->field_0x4 = uVar8;
    pFVar5[-1].val2.v = aVar7;
    pFVar5[-1].str._M_string_length = 0;
    *pFVar5[-1].str._M_dataplus._M_p = L'\0';
    pFVar5[-1].first = true;
    pFVar5[-1].elementId = 0;
    pAVar9 = joinStrings(this);
    return pAVar9;
  }
  pFVar5[-1].kind = FRAME_BUILTIN_JOIN_ARRAYS;
  uVar8 = *(undefined4 *)&pVVar4->field_0x4;
  aVar7 = pVVar4->v;
  pVVar1->t = pVVar4->t;
  *(undefined4 *)&pVVar1->field_0x4 = uVar8;
  pFVar5[-1].val.v = aVar7;
  pVVar4 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(undefined4 *)&pVVar4[1].field_0x4;
  aVar7 = pVVar4[1].v;
  pVVar2->t = pVVar4[1].t;
  *(undefined4 *)&pVVar2->field_0x4 = uVar8;
  pFVar5[-1].val2.v = aVar7;
  ppHVar6 = pFVar5[-1].thunks.
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar5[-1].thunks.
      super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppHVar6) {
    pFVar5[-1].thunks.
    super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppHVar6;
  }
  pFVar5[-1].first = true;
  pFVar5[-1].elementId = 0;
  pAVar9 = joinArrays(this);
  return pAVar9;
}

Assistant:

const AST *builtinJoin(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args[0].t != Value::ARRAY && args[0].t != Value::STRING) {
            std::stringstream ss;
            ss << "join first parameter should be string or array, got " << type_str(args[0]);
            throw makeError(loc, ss.str());
        }
        if (args[1].t != Value::ARRAY) {
            std::stringstream ss;
            ss << "join second parameter should be array, got " << type_str(args[1]);
            throw makeError(loc, ss.str());
        }
        Frame &f = stack.top();
        if (args[0].t == Value::STRING) {
            f.kind = FRAME_BUILTIN_JOIN_STRINGS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.str.clear();
            f.first = true;
            f.elementId = 0;
            return joinStrings();
        } else {
            f.kind = FRAME_BUILTIN_JOIN_ARRAYS;
            f.val = args[0];  // sep
            f.val2 = args[1];  // arr
            f.thunks.clear();
            f.first = true;
            f.elementId = 0;
            return joinArrays();
        }
    }